

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *ci,_Bool httpheader,_Bool noexpire,
                        char *lineptr,char *domain,char *path,_Bool secure)

{
  char **str;
  curl_off_t *num;
  char **str_00;
  char **str_01;
  uchar *puVar1;
  char cVar2;
  char cVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  CURLofft CVar9;
  int iVar10;
  Cookie *co;
  size_t sVar11;
  time_t tVar12;
  char *pcVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  void *pvVar17;
  time_t tVar18;
  curl_off_t cVar19;
  size_t sVar20;
  Curl_llist_node *n;
  Cookie *co_00;
  psl_ctx_t *ppVar21;
  bool bVar22;
  char *pcVar23;
  Curl_llist_node *n_00;
  char *pcVar24;
  bool bVar25;
  char *local_270;
  char lcase [256];
  char local_138 [264];
  
  if (0x31 < (data->req).setcookies) {
    return (Cookie *)0x0;
  }
  co = (Cookie *)(*Curl_ccalloc)(1,0x78);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar11 = strlen(lineptr);
    if (5000 < sVar11) goto LAB_0011cf0f;
    tVar12 = time((time_t *)0x0);
    str = &co->name;
    num = &co->expires;
    str_00 = &co->domain;
    str_01 = &co->path;
    while ((cVar2 = *lineptr, local_270 = lineptr, cVar2 == '\t' || (cVar2 == ' '))) {
LAB_0011ced0:
      lineptr = local_270 + 1;
    }
    pcVar13 = (char *)strcspn(lineptr,";\t\r\n=");
    if (pcVar13 == (char *)0x0) goto LAB_0011ceac;
    local_270 = pcVar13 + (long)lineptr;
    do {
      pcVar24 = pcVar13;
      if (pcVar24 == (char *)0x0) break;
      pcVar13 = pcVar24 + -1;
    } while (((lineptr + -1)[(long)pcVar24] == ' ') || ((lineptr + -1)[(long)pcVar24] == '\t'));
    cVar3 = *local_270;
    if (cVar3 == '=') {
      pcVar13 = local_270 + 1;
      sVar14 = strcspn(pcVar13,";\r\n");
      sVar11 = sVar14;
      do {
        sVar15 = sVar11;
        if (sVar15 == 0) break;
        sVar11 = sVar15 - 1;
      } while ((local_270[sVar15] == ' ') || (local_270[sVar15] == '\t'));
      for (lVar16 = 0;
          (pcVar23 = (char *)(sVar15 - lVar16), pcVar23 != (char *)0x0 &&
          ((pcVar13[lVar16] == ' ' || (pcVar13[lVar16] == '\t')))); lVar16 = lVar16 + 1) {
      }
      pcVar13 = pcVar13 + lVar16;
      pvVar17 = memchr(pcVar13,9,(size_t)pcVar23);
      local_270 = local_270 + sVar14 + 1;
      if (pvVar17 == (void *)0x0) goto LAB_0011caf9;
      if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
      goto LAB_0011cf0f;
      pcVar13 = "cookie contains TAB, dropping";
    }
    else {
      pcVar13 = (char *)0x0;
      pcVar23 = (char *)0x0;
LAB_0011caf9:
      if ((((char *)0xffe < pcVar24) || ((char *)0xffe < pcVar23)) ||
         ((char *)0x1000 < pcVar24 + (long)pcVar23)) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          pcVar13 = "oversized cookie dropped, name/val %zu + %zu bytes";
LAB_0011d689:
          Curl_infof(data,pcVar13,pcVar24,pcVar23);
        }
        goto LAB_0011cf0f;
      }
      if ((cVar2 == '_' && (char *)0x6 < pcVar24) && (lineptr[1] == '_')) {
        iVar8 = curl_strnequal("__Secure-",lineptr,9);
        bVar6 = 0x10;
        if (iVar8 == 0) {
          iVar8 = curl_strnequal("__Host-",lineptr,7);
          bVar6 = 0x20;
          if (iVar8 == 0) goto LAB_0011cb73;
        }
        co->field_0x74 = co->field_0x74 | bVar6;
      }
LAB_0011cb73:
      if (*str != (char *)0x0) {
        if (pcVar23 == (char *)0x0) {
          if (pcVar24 == (char *)0x8) {
            iVar8 = curl_strnequal("httponly",lineptr,8);
            if (iVar8 == 0) goto LAB_0011cdd4;
            co->field_0x74 = co->field_0x74 | 8;
          }
          else if ((pcVar24 == (char *)0x6) &&
                  (iVar8 = curl_strnequal("secure",lineptr,6), iVar8 != 0)) {
            if ((!secure) && (ci->running != false)) goto LAB_0011cf0f;
            co->field_0x74 = co->field_0x74 | 2;
          }
          else {
LAB_0011cdd4:
            if (cVar3 == '=') goto LAB_0011cb87;
          }
        }
        else {
LAB_0011cb87:
          if (pcVar24 == (char *)0x7) {
            iVar8 = curl_strnequal("version",lineptr,7);
            if (iVar8 == 0) {
              iVar8 = curl_strnequal("max-age",lineptr,7);
              if (iVar8 == 0) {
                iVar8 = curl_strnequal("expires",lineptr,7);
                if ((iVar8 != 0) && (*num == 0)) {
                  tVar18 = Curl_getdate_capped(pcVar13);
                  *num = tVar18;
                  if (tVar18 == 0) goto LAB_0011ce9b;
                  if (tVar18 < 0) {
                    *num = 0;
                  }
                }
              }
              else {
                CVar9 = curlx_strtoofft(pcVar13 + (*pcVar13 == '\"'),(char **)0x0,10,num);
                if (CVar9 == CURL_OFFT_OK) {
                  lVar16 = *num;
                  if (lVar16 == 0) goto LAB_0011ce9b;
                  if (0x7fffffffffffffff - tVar12 < lVar16) goto LAB_0011ce87;
                  cVar19 = lVar16 + tVar12;
                }
                else {
                  if (CVar9 == CURL_OFFT_INVAL) {
LAB_0011ce9b:
                    *num = 1;
                    goto LAB_0011ceac;
                  }
                  if (CVar9 != CURL_OFFT_FLOW) goto LAB_0011ceac;
LAB_0011ce87:
                  cVar19 = 0x7fffffffffffffff;
                }
                *num = cVar19;
              }
            }
          }
          else if (pcVar24 == (char *)0x6) {
            iVar8 = curl_strnequal("domain",lineptr,6);
            if ((pcVar23 != (char *)0x0) && (iVar8 != 0)) {
              pcVar24 = pcVar13 + (*pcVar13 == '.');
              sVar20 = (long)pcVar23 - (ulong)(*pcVar13 == '.');
              pcVar13 = domain;
              if (domain == (char *)0x0) {
                pcVar13 = pcVar24;
              }
              _Var7 = Curl_host_is_ipnum(pcVar13);
              if (domain != (char *)0x0) {
                if (_Var7) {
                  iVar8 = strncmp(pcVar24,domain,sVar20);
                  if ((iVar8 != 0) || (sVar11 = strlen(domain), sVar20 != sVar11)) {
LAB_0011d8a8:
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                       ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar4->log_level)))) {
                      Curl_infof(data,"skipped cookie with bad tailmatch domain: %s",pcVar24);
                    }
                    goto LAB_0011cf0f;
                  }
                }
                else {
                  _Var5 = cookie_tailmatch(pcVar24,sVar20,domain);
                  if (!_Var5) goto LAB_0011d8a8;
                }
              }
              strstore(str_00,pcVar24,sVar20);
              pcVar13 = *str_00;
              if (pcVar13 == (char *)0x0 || _Var7) goto LAB_0011ce1c;
              co->field_0x74 = co->field_0x74 | 1;
            }
          }
          else if ((pcVar24 == (char *)0x4) &&
                  (iVar8 = curl_strnequal("path",lineptr,4), iVar8 != 0)) {
            strstore(str_01,pcVar13,(size_t)pcVar23);
            if (*str_01 == (char *)0x0) goto LAB_0011cf0f;
            (*Curl_cfree)(co->spath);
            pcVar13 = sanitize_cookie_path(co->path);
            co->spath = pcVar13;
LAB_0011ce1c:
            if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
          }
        }
LAB_0011ceac:
        for (; (cVar2 = *local_270, cVar2 == '\t' || (cVar2 == ' ')); local_270 = local_270 + 1) {
        }
        if (cVar2 == ';') goto LAB_0011ced0;
        if ((domain != (char *)0x0) && (*str_00 == (char *)0x0)) {
          pcVar13 = (*Curl_cstrdup)(domain);
          *str_00 = pcVar13;
          if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
        }
        if ((path != (char *)0x0) && (*str_01 == (char *)0x0)) {
          pcVar13 = strchr(path,0x3f);
          if (pcVar13 == (char *)0x0) {
            pcVar13 = strrchr(path,0x2f);
          }
          else {
            pcVar13 = (char *)memrchr(path,0x2f,(long)pcVar13 - (long)path);
          }
          if (pcVar13 != (char *)0x0) {
            pcVar13 = (char *)Curl_memdup0(path,(size_t)(pcVar13 + (1 - (long)path)));
            *str_01 = pcVar13;
            if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
            pcVar13 = sanitize_cookie_path(pcVar13);
            co->spath = pcVar13;
            if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
          }
        }
        if (*str == (char *)0x0) goto LAB_0011cf0f;
        puVar1 = &(data->req).setcookies;
        *puVar1 = *puVar1 + '\x01';
        goto LAB_0011d2b7;
      }
      if (cVar3 != '=') goto LAB_0011cf0f;
      strstore(str,lineptr,(size_t)pcVar24);
      strstore(&co->value,pcVar13,(size_t)pcVar23);
      pcVar13 = *str;
      if ((pcVar13 == (char *)0x0) || (pcVar24 = co->value, pcVar24 == (char *)0x0))
      goto LAB_0011cf0f;
      iVar8 = invalid_octets(pcVar24);
      if ((iVar8 == 0) && (iVar8 = invalid_octets(pcVar13), iVar8 == 0)) goto LAB_0011ceac;
      if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
      goto LAB_0011cf0f;
      pcVar13 = "invalid octets in name/value, cookie dropped";
    }
    Curl_infof(data,pcVar13);
  }
  else {
    lcase[0] = '\0';
    lcase[1] = '\0';
    lcase[2] = '\0';
    lcase[3] = '\0';
    lcase[4] = '\0';
    lcase[5] = '\0';
    lcase[6] = '\0';
    lcase[7] = '\0';
    iVar8 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar8 == 0) {
      lineptr = lineptr + 10;
      co->field_0x74 = co->field_0x74 | 8;
    }
    if (*lineptr == '#') goto LAB_0011cf0f;
    pcVar13 = strchr(lineptr,0xd);
    if (pcVar13 != (char *)0x0) {
      *pcVar13 = '\0';
    }
    pcVar13 = strchr(lineptr,10);
    if (pcVar13 != (char *)0x0) {
      *pcVar13 = '\0';
    }
    pcVar13 = strtok_r(lineptr,"\t",(char **)lcase);
    iVar8 = 0;
    while (pcVar13 != (char *)0x0) {
      switch(iVar8) {
      case 0:
        pcVar13 = (*Curl_cstrdup)(pcVar13 + (*pcVar13 == '.'));
        co->domain = pcVar13;
        iVar8 = 0;
        goto LAB_0011d0cc;
      case 1:
        iVar8 = curl_strequal(pcVar13,"TRUE");
        bVar6 = co->field_0x74 & 0xfe | iVar8 != 0;
        iVar8 = 1;
        goto LAB_0011d15b;
      case 2:
        iVar8 = strcmp("TRUE",pcVar13);
        if ((iVar8 == 0) || (iVar8 = strcmp("FALSE",pcVar13), iVar8 == 0)) {
          pcVar24 = (*Curl_cstrdup)("/");
          co->path = pcVar24;
          if (pcVar24 != (char *)0x0) {
            pcVar24 = (*Curl_cstrdup)("/");
            co->spath = pcVar24;
            if (pcVar24 != (char *)0x0) goto switchD_0011cfab_caseD_3;
          }
        }
        else {
          pcVar13 = (*Curl_cstrdup)(pcVar13);
          co->path = pcVar13;
          if (pcVar13 != (char *)0x0) {
            pcVar13 = sanitize_cookie_path(pcVar13);
            co->spath = pcVar13;
            iVar8 = 2;
            goto LAB_0011d0cc;
          }
        }
        goto LAB_0011cf0f;
      case 3:
switchD_0011cfab_caseD_3:
        co->field_0x74 = co->field_0x74 & 0xfd;
        iVar10 = curl_strequal(pcVar13,"TRUE");
        iVar8 = 3;
        if (iVar10 != 0) {
          if ((secure) || (ci->running == true)) {
            bVar6 = co->field_0x74 | 2;
            goto LAB_0011d15b;
          }
          goto LAB_0011cf0f;
        }
        break;
      case 4:
        CVar9 = curlx_strtoofft(pcVar13,(char **)0x0,10,&co->expires);
        iVar8 = 4;
        if (CVar9 != CURL_OFFT_OK) goto LAB_0011cf0f;
        break;
      case 5:
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        co->name = pcVar13;
        if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
        iVar8 = curl_strnequal("__Secure-",pcVar13,9);
        if (iVar8 == 0) {
          iVar10 = curl_strnequal("__Host-",co->name,7);
          iVar8 = 5;
          if (iVar10 == 0) break;
          bVar6 = co->field_0x74 | 0x20;
        }
        else {
          bVar6 = co->field_0x74 | 0x10;
          iVar8 = 5;
        }
LAB_0011d15b:
        co->field_0x74 = bVar6;
        break;
      case 6:
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        co->value = pcVar13;
        iVar8 = 6;
LAB_0011d0cc:
        if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
      }
      pcVar13 = strtok_r((char *)0x0,"\t",(char **)lcase);
      iVar8 = iVar8 + 1;
    }
    if (iVar8 != 7) {
      if (iVar8 != 6) goto LAB_0011cf0f;
      pcVar13 = (*Curl_cstrdup)("");
      co->value = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_0011cf0f;
    }
LAB_0011d2b7:
    bVar6 = co->field_0x74;
    if ((((bVar6 & 0x12) != 0x10) &&
        (((bVar6 & 0x20) == 0 ||
         (((((bVar6 & 2) != 0 && (pcVar13 = co->path, pcVar13 != (char *)0x0)) && (*pcVar13 == '/'))
          && ((bVar6 & 1) == 0 && pcVar13[1] == '\0')))))) &&
       (((ci->running != false || (ci->newsession != true)) || (co->expires != 0)))) {
      co->field_0x74 = bVar6 & 0xfb | ci->running << 2;
      iVar8 = ci->lastct + 1;
      ci->lastct = iVar8;
      co->creationtime = iVar8;
      if (!noexpire) {
        remove_expired(ci);
      }
      if (((domain == (char *)0x0 || data == (Curl_easy *)0x0) || (co->domain == (char *)0x0)) ||
         (_Var7 = Curl_host_is_ipnum(co->domain), _Var7)) {
LAB_0011d357:
        sVar20 = cookiehash(co->domain);
        n = Curl_llist_head(ci->cookielist + sVar20);
        n_00 = (Curl_llist_node *)0x0;
        bVar22 = false;
        do {
          if (n == (Curl_llist_node *)0x0) {
            if (n_00 != (Curl_llist_node *)0x0) {
              co_00 = (Cookie *)Curl_node_elem(n_00);
              co->creationtime = co_00->creationtime;
              Curl_node_remove(n_00);
              freecookie(co_00);
            }
            sVar20 = cookiehash(co->domain);
            Curl_llist_append(ci->cookielist + sVar20,co,(Curl_llist_node *)co);
            if ((((data != (Curl_easy *)0x0) && (ci->running != false)) &&
                (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              pcVar13 = "Added";
              if (bVar22) {
                pcVar13 = "Replaced";
              }
              Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld",pcVar13,
                         co->name,co->value,co->domain,co->path,co->expires);
            }
            if (!bVar22) {
              ci->numcookies = ci->numcookies + 1;
            }
            lVar16 = co->expires;
            if (lVar16 != 0) {
              if (lVar16 < ci->next_expiration) {
                ci->next_expiration = lVar16;
                return co;
              }
              return co;
            }
            return co;
          }
          pvVar17 = Curl_node_elem(n);
          iVar8 = curl_strequal(*(char **)((long)pvVar17 + 0x40),co->name);
          if (iVar8 != 0) {
            pcVar13 = co->domain;
            if (*(char **)((long)pvVar17 + 0x60) == (char *)0x0) {
              if (pcVar13 == (char *)0x0) goto LAB_0011d3c7;
            }
            else if ((pcVar13 != (char *)0x0) &&
                    (iVar8 = curl_strequal(*(char **)((long)pvVar17 + 0x60),pcVar13), iVar8 != 0)) {
LAB_0011d3c7:
              pcVar13 = *(char **)((long)pvVar17 + 0x58);
              if ((pcVar13 != (char *)0x0) &&
                 (((pcVar24 = co->spath, pcVar24 != (char *)0x0 &&
                   ((*(byte *)((long)pvVar17 + 0x74) & 2) != 0)) &&
                  ((co->field_0x74 & 2) == 0 && !secure)))) {
                pcVar23 = strchr(pcVar13 + 1,0x2f);
                if (pcVar23 == (char *)0x0) {
                  sVar20 = strlen(pcVar13);
                }
                else {
                  sVar20 = (long)pcVar23 - (long)pcVar13;
                }
                iVar8 = curl_strnequal(pcVar13,pcVar24,sVar20);
                if (iVar8 != 0) {
                  if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
                     ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 &&
                      (pcVar4->log_level < 1)))) goto LAB_0011cf0f;
                  pcVar24 = co->name;
                  pcVar23 = co->domain;
                  pcVar13 = 
                  "cookie \'%s\' for domain \'%s\' dropped, would overlay an existing cookie";
                  goto LAB_0011d689;
                }
              }
            }
          }
          if (n_00 == (Curl_llist_node *)0x0) {
            iVar8 = curl_strequal(*(char **)((long)pvVar17 + 0x40),co->name);
            if (iVar8 != 0) {
              pcVar13 = co->domain;
              if (*(char **)((long)pvVar17 + 0x60) == (char *)0x0) {
                bVar25 = pcVar13 == (char *)0x0;
LAB_0011d47d:
                if (bVar25) {
                  bVar22 = true;
                }
              }
              else if ((pcVar13 != (char *)0x0) &&
                      (iVar8 = curl_strequal(*(char **)((long)pvVar17 + 0x60),pcVar13), iVar8 != 0))
              {
                bVar25 = ((co->field_0x74 ^ *(byte *)((long)pvVar17 + 0x74)) & 1) == 0;
                goto LAB_0011d47d;
              }
              if (bVar22) {
                pcVar13 = co->spath;
                if (*(char **)((long)pvVar17 + 0x58) == (char *)0x0) {
                  bVar25 = true;
                }
                else if (pcVar13 == (char *)0x0) {
                  pcVar13 = (char *)0x0;
                  bVar25 = false;
                }
                else {
                  iVar8 = curl_strequal(*(char **)((long)pvVar17 + 0x58),pcVar13);
                  if (iVar8 == 0) {
                    bVar22 = false;
                    n_00 = (Curl_llist_node *)0x0;
                    goto LAB_0011d501;
                  }
                  pcVar13 = co->spath;
                  bVar25 = *(long *)((long)pvVar17 + 0x58) == 0;
                }
                if ((pcVar13 != (char *)0x0) == bVar25) {
                  bVar22 = false;
                }
              }
              if (bVar22) {
                n_00 = n;
                if (((co->field_0x74 & 4) != 0) || ((*(byte *)((long)pvVar17 + 0x74) & 4) == 0))
                goto LAB_0011d501;
                goto LAB_0011cf0f;
              }
            }
            n_00 = (Curl_llist_node *)0x0;
          }
LAB_0011d501:
          n = Curl_node_next(n);
        } while( true );
      }
      sVar11 = strlen(domain);
      sVar14 = strlen(co->domain);
      if ((sVar11 < 0x100) && (sVar14 < 0x100)) {
        ppVar21 = Curl_psl_use(data);
        if (ppVar21 == (psl_ctx_t *)0x0) {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"libpsl problem, rejecting cookie for satety");
          }
        }
        else {
          Curl_strntolower(lcase,domain,sVar11 + 1);
          Curl_strntolower(local_138,co->domain,sVar14 + 1);
          iVar8 = psl_is_cookie_domain_acceptable(ppVar21,lcase,local_138);
          Curl_psl_release(data);
          if (iVar8 != 0) goto LAB_0011d357;
        }
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"cookie \'%s\' dropped, domain \'%s\' must not set cookies for \'%s\'",
                   co->name,domain,co->domain);
      }
    }
  }
LAB_0011cf0f:
  freecookie(co);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                struct CookieInfo *ci,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                const char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *co;
  size_t myhash;
  int rc;
  bool replaces = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(MAX_SET_COOKIE_AMOUNT <= 255); /* counter is an unsigned char */
  if(data->req.setcookies >= MAX_SET_COOKIE_AMOUNT)
    return NULL;

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we are this low on memory */

  if(httpheader)
    rc = parse_cookie_header(data, co, ci, lineptr, domain, path, secure);
  else
    rc = parse_netscape(co, ci, lineptr, secure);

  if(rc)
    goto fail;

  if(co->prefix_secure && !co->secure)
    /* The __Secure- prefix only requires that the cookie be set secure */
    goto fail;

  if(co->prefix_host) {
    /*
     * The __Host- prefix requires the cookie to be secure, have a "/" path
     * and not have a domain set.
     */
    if(co->secure && co->path && strcmp(co->path, "/") == 0 && !co->tailmatch)
      ;
    else
      goto fail;
  }

  if(!ci->running &&    /* read from a file */
     ci->newsession &&  /* clean session cookies */
     !co->expires)      /* this is a session cookie since it does not expire */
    goto fail;

  co->livecookie = ci->running;
  co->creationtime = ++ci->lastct;

  /*
   * Now we have parsed the incoming line, we must now check if this supersedes
   * an already existing cookie, which it may if the previous have the same
   * domain and path as this.
   */

  /* remove expired cookies */
  if(!noexpire)
    remove_expired(ci);

  if(is_public_suffix(data, co, domain))
    goto fail;

  if(replace_existing(data, co, ci, secure, &replaces))
    goto fail;

  /* add this cookie to the list */
  myhash = cookiehash(co->domain);
  Curl_llist_append(&ci->cookielist[myhash], co, &co->node);

  if(ci->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" FMT_OFF_T,
          replaces ? "Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replaces)
    ci->numcookies++; /* one more cookie in the jar */

  /*
   * Now that we have added a new cookie to the jar, update the expiration
   * tracker in case it is the next one to expire.
   */
  if(co->expires && (co->expires < ci->next_expiration))
    ci->next_expiration = co->expires;

  return co;
fail:
  freecookie(co);
  return NULL;
}